

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatin.cpp
# Opt level: O3

uint32_t icu_63::CollationFastLatin::nextPair
                   (uint16_t *table,UChar32 c,uint32_t ce,UChar *s16,uint8_t *s8,int32_t *sIndex,
                   int32_t *sLength)

{
  byte bVar1;
  UChar UVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  if (ce - 0xc00 < 0xfffff800) {
    return ce;
  }
  if (0x7ff < ce) {
    return *(uint32_t *)(table + (ulong)(ce & 0x3ff) + 0x1c0);
  }
  iVar3 = *sLength;
  if (iVar3 < 0 && c == 0) {
    *sLength = *sIndex + -1;
    return 2;
  }
  uVar8 = (ce & 0x3ff) + 0x1c0;
  iVar4 = *sIndex;
  if (iVar4 == iVar3) goto LAB_00234650;
  lVar11 = (long)iVar4;
  uVar9 = lVar11 + 1;
  if (s16 == (UChar *)0x0) {
    bVar1 = s8[lVar11];
    uVar7 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if (((int)uVar9 == iVar3 || (byte)(bVar1 + 0x3a) < 0xfc) || (-0x41 < (char)s8[uVar9])) {
        if (-1 < iVar3 && iVar3 <= (int)(lVar11 + 2)) {
          return 1;
        }
        if (uVar7 != 0xef) {
          return 1;
        }
        if (s8[uVar9] != 0xbf) {
          return 1;
        }
        uVar7 = 0xffffffff;
        if ((s8[lVar11 + 2] & 0xfe) != 0xbe) {
          return 1;
        }
        uVar9 = (ulong)(iVar4 + 3);
        goto LAB_00234625;
      }
      uVar7 = (uVar7 * 0x40 + (uint)s8[uVar9]) - 0x3080;
      uVar9 = (ulong)(iVar4 + 2);
    }
LAB_00234609:
    if (uVar7 == 0 && iVar3 < 0) {
      *sLength = iVar4;
      uVar7 = 0xffffffff;
    }
  }
  else {
    UVar2 = s16[lVar11];
    uVar7 = (uint)(ushort)UVar2;
    if ((ushort)UVar2 < 0x180) goto LAB_00234609;
    if ((UVar2 & 0xffc0U) == 0x2000) {
      uVar7 = (ushort)UVar2 - 0x1e80;
      goto LAB_00234609;
    }
    uVar7 = 0xffffffff;
    if ((ushort)UVar2 < 0xfffe) {
      return 1;
    }
  }
LAB_00234625:
  uVar10 = (uint)table[uVar8];
  uVar6 = (ulong)uVar8;
  do {
    uVar5 = (int)uVar6 + (uVar10 >> 9);
    uVar6 = (ulong)uVar5;
    uVar10 = (uint)table[uVar6];
  } while ((int)(uVar10 & 0x1ff) < (int)uVar7);
  if ((uVar10 & 0x1ff) == uVar7) {
    *sIndex = (int32_t)uVar9;
    uVar8 = uVar5;
  }
LAB_00234650:
  lVar11 = (long)(int)uVar8;
  uVar8 = 1;
  if (table[lVar11] >> 9 != 1) {
    uVar8 = (uint)table[lVar11 + 1];
    if (table[lVar11] >> 9 != 2) {
      uVar8 = CONCAT22(table[lVar11 + 2],table[lVar11 + 1]);
    }
  }
  return uVar8;
}

Assistant:

uint32_t
CollationFastLatin::nextPair(const uint16_t *table, UChar32 c, uint32_t ce,
                             const UChar *s16, const uint8_t *s8, int32_t &sIndex, int32_t &sLength) {
    if(ce >= MIN_LONG || ce < CONTRACTION) {
        return ce;  // simple or special mini CE
    } else if(ce >= EXPANSION) {
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        return ((uint32_t)table[index + 1] << 16) | table[index];
    } else /* ce >= CONTRACTION */ {
        if(c == 0 && sLength < 0) {
            sLength = sIndex - 1;
            return EOS;
        }
        // Contraction list: Default mapping followed by
        // 0 or more single-character contraction suffix mappings.
        int32_t index = NUM_FAST_CHARS + (ce & INDEX_MASK);
        if(sIndex != sLength) {
            // Read the next character.
            int32_t c2;
            int32_t nextIndex = sIndex;
            if(s16 != NULL) {
                c2 = s16[nextIndex++];
                if(c2 > LATIN_MAX) {
                    if(PUNCT_START <= c2 && c2 < PUNCT_LIMIT) {
                        c2 = c2 - PUNCT_START + LATIN_LIMIT;  // 2000..203F -> 0180..01BF
                    } else if(c2 == 0xfffe || c2 == 0xffff) {
                        c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                    } else {
                        return BAIL_OUT;
                    }
                }
            } else {
                c2 = s8[nextIndex++];
                if(c2 > 0x7f) {
                    uint8_t t;
                    if(c2 <= 0xc5 && 0xc2 <= c2 && nextIndex != sLength &&
                            0x80 <= (t = s8[nextIndex]) && t <= 0xbf) {
                        c2 = ((c2 - 0xc2) << 6) + t;  // 0080..017F
                        ++nextIndex;
                    } else {
                        int32_t i2 = nextIndex + 1;
                        if(i2 < sLength || sLength < 0) {
                            if(c2 == 0xe2 && s8[nextIndex] == 0x80 &&
                                    0x80 <= (t = s8[i2]) && t <= 0xbf) {
                                c2 = (LATIN_LIMIT - 0x80) + t;  // 2000..203F -> 0180..01BF
                            } else if(c2 == 0xef && s8[nextIndex] == 0xbf &&
                                    ((t = s8[i2]) == 0xbe || t == 0xbf)) {
                                c2 = -1;  // U+FFFE & U+FFFF cannot occur in contractions.
                            } else {
                                return BAIL_OUT;
                            }
                        } else {
                            return BAIL_OUT;
                        }
                        nextIndex += 2;
                    }
                }
            }
            if(c2 == 0 && sLength < 0) {
                sLength = sIndex;
                c2 = -1;
            }
            // Look for the next character in the contraction suffix list,
            // which is in ascending order of single suffix characters.
            int32_t i = index;
            int32_t head = table[i];  // first skip the default mapping
            int32_t x;
            do {
                i += head >> CONTR_LENGTH_SHIFT;
                head = table[i];
                x = head & CONTR_CHAR_MASK;
            } while(x < c2);
            if(x == c2) {
                index = i;
                sIndex = nextIndex;
            }
        }
        // Return the CE or CEs for the default or contraction mapping.
        int32_t length = table[index] >> CONTR_LENGTH_SHIFT;
        if(length == 1) {
            return BAIL_OUT;
        }
        ce = table[index + 1];
        if(length == 2) {
            return ce;
        } else {
            return ((uint32_t)table[index + 2] << 16) | ce;
        }
    }
}